

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crossover.cc
# Opt level: O3

Int __thiscall
ipx::Crossover::DualRatioTest
          (Crossover *this,Vector *z,IndexedVector *row,int *sign_restrict,double step,
          double feastol)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Int IVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  bVar3 = IndexedVector::sparse(row);
  if (bVar3) {
    if ((long)row->nnz_ < 1) {
      return -1;
    }
    iVar4 = -1;
    lVar10 = 0;
    do {
      iVar5 = (row->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10];
      dVar11 = (row->elements_)._M_data[iVar5];
      if (1e-05 < ABS(dVar11)) {
        if (((sign_restrict[iVar5] & 1U) != 0) &&
           (dVar1 = z->_M_data[iVar5], dVar1 - step * dVar11 < -feastol)) {
          step = (dVar1 + feastol) / dVar11;
          iVar4 = iVar5;
        }
        if (((sign_restrict[iVar5] & 2U) != 0) &&
           (dVar1 = z->_M_data[iVar5], feastol < dVar1 - step * dVar11)) {
          step = (dVar1 - feastol) / dVar11;
          iVar4 = iVar5;
        }
      }
      lVar10 = lVar10 + 1;
    } while (row->nnz_ != lVar10);
  }
  else {
    uVar8 = (uint)(row->elements_)._M_size;
    if ((int)uVar8 < 1) {
      return -1;
    }
    iVar4 = -1;
    uVar7 = 0;
    do {
      dVar11 = (row->elements_)._M_data[uVar7];
      if (1e-05 < ABS(dVar11)) {
        if (((sign_restrict[uVar7] & 1U) != 0) &&
           (dVar1 = z->_M_data[uVar7], dVar1 - step * dVar11 < -feastol)) {
          step = (dVar1 + feastol) / dVar11;
          iVar4 = (int)uVar7;
        }
        if (((sign_restrict[uVar7] & 2U) != 0) &&
           (dVar1 = z->_M_data[uVar7], feastol < dVar1 - step * dVar11)) {
          step = (dVar1 - feastol) / dVar11;
          iVar4 = (int)uVar7;
        }
      }
      uVar7 = uVar7 + 1;
    } while ((uVar8 & 0x7fffffff) != uVar7);
  }
  if (-1 < iVar4) {
    bVar3 = IndexedVector::sparse(row);
    if (bVar3) {
      if (0 < (long)row->nnz_) {
        dVar11 = 1e-05;
        iVar5 = -1;
        iVar4 = -1;
        lVar10 = 0;
        do {
          iVar2 = (row->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar10];
          dVar1 = (row->elements_)._M_data[iVar2];
          dVar12 = ABS(dVar1);
          if ((dVar11 < dVar12) && (ABS(z->_M_data[iVar2] / dVar1) <= ABS(step))) {
            dVar13 = dVar12;
            iVar4 = iVar2;
            if (((byte)sign_restrict[iVar2] & 0.0 < dVar1 * step) == 0) {
              dVar13 = dVar11;
              iVar4 = iVar5;
            }
            dVar11 = dVar13;
            iVar5 = iVar4;
            if (((sign_restrict[iVar2] & 2U) != 0) && (dVar1 * step < 0.0)) {
              dVar11 = dVar12;
              iVar4 = iVar2;
              iVar5 = iVar2;
            }
          }
          lVar10 = lVar10 + 1;
        } while (row->nnz_ != lVar10);
        return iVar4;
      }
    }
    else {
      uVar8 = (uint)(row->elements_)._M_size;
      if (0 < (int)uVar8) {
        dVar11 = 1e-05;
        uVar7 = 0xffffffff;
        IVar6 = -1;
        uVar9 = 0;
        do {
          dVar1 = (row->elements_)._M_data[uVar9];
          dVar12 = ABS(dVar1);
          if ((dVar11 < dVar12) && (ABS(z->_M_data[uVar9] / dVar1) <= ABS(step))) {
            IVar6 = (Int)uVar7;
            if (((byte)sign_restrict[uVar9] & 0.0 < dVar1 * step) != 0) {
              uVar7 = uVar9 & 0xffffffff;
              dVar11 = dVar12;
              IVar6 = (Int)uVar9;
            }
            if (((sign_restrict[uVar9] & 2U) != 0) && (dVar1 * step < 0.0)) {
              uVar7 = uVar9 & 0xffffffff;
              dVar11 = dVar12;
              IVar6 = (Int)uVar9;
            }
          }
          uVar9 = uVar9 + 1;
        } while ((uVar8 & 0x7fffffff) != uVar9);
        return IVar6;
      }
    }
    return -1;
  }
  return iVar4;
}

Assistant:

Int Crossover::DualRatioTest(const Vector& z, const IndexedVector& row,
                             const int sign_restrict[], double step,
                             double feastol) {
    Int jblock = -1;            // return value

    // First pass: determine maximum step size exploiting feasibility tol.
    auto update_step = [&](Int j, double pivot) {
        if (std::abs(pivot) > kPivotZeroTol) {
            if ((sign_restrict[j] & 1) && z[j]-step*pivot < -feastol) {
                step = (z[j]+feastol) / pivot;
                jblock = j;
                assert(z[j] >= 0.0);
                assert(step*pivot > 0.0);
            }
            if ((sign_restrict[j] & 2) && z[j]-step*pivot > feastol) {
                step = (z[j]-feastol) / pivot;
                jblock = j;
                assert(z[j] <= 0.0);
                assert(step*pivot < 0.0);
            }
        }
    };
    for_each_nonzero(row, update_step);

    // If step was not block, we are done.
    if (jblock < 0)
        return jblock;

    // Second pass: choose maximum pivot among all that block within step.
    jblock = -1;
    double max_pivot = kPivotZeroTol;
    auto update_max = [&](Int j, double pivot) {
        if (std::abs(pivot) > max_pivot &&
            std::abs(z[j]/pivot) <= std::abs(step)) {
            if ((sign_restrict[j] & 1) && step*pivot > 0.0) {
                jblock = j;
                max_pivot = std::abs(pivot);
            }
            if ((sign_restrict[j] & 2) && step*pivot < 0.0) {
                jblock = j;
                max_pivot = std::abs(pivot);
            }
        }
    };
    for_each_nonzero(row, update_max);
    assert(jblock >= 0);
    return jblock;
}